

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringLifting.cpp
# Opt level: O0

void __thiscall
wasm::StringLifting::run(wasm::Module*)::StringApplier::visitFunction(wasm::Function__
          (void *this,Function *curr)

{
  Function *func;
  Module *module;
  ReFinalize local_180;
  Function *local_18;
  Function *curr_local;
  StringApplier *this_local;
  
  if ((*(byte *)((long)this + 0x138) & 1) != 0) {
    local_18 = curr;
    curr_local = (Function *)this;
    ReFinalize::ReFinalize(&local_180);
    func = local_18;
    module = Walker<StringApplier,_wasm::Visitor<StringApplier,_void>_>::getModule
                       ((Walker<StringApplier,_wasm::Visitor<StringApplier,_void>_> *)
                        ((long)this + 0x58));
    Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::walkFunctionInModule
              (&local_180.
                super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
                .
                super_PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>
                .super_Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>,
               func,module);
    ReFinalize::~ReFinalize(&local_180);
  }
  return;
}

Assistant:

void visitFunction(Function* curr) {
        // If we made modifications then we need to refinalize, as we replace
        // externrefs with stringrefs, a subtype.
        if (modified) {
          ReFinalize().walkFunctionInModule(curr, getModule());
        }
      }